

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleDemoNoTemplates.cpp
# Opt level: O0

void demo1(void)

{
  ostream *this;
  Param param;
  IMLE imleObj;
  int D;
  int d;
  int in_stack_000005dc;
  IMLE *in_stack_000005e0;
  IMLE *in_stack_00000780;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *in_stack_fffffffffffffb28;
  Matrix<double,__1,_1,_0,__1,_1> *this_00;
  Param *in_stack_fffffffffffffb40;
  Index in_stack_fffffffffffffb48;
  Param *in_stack_fffffffffffffb68;
  IMLE *in_stack_fffffffffffffb70;
  int in_stack_fffffffffffffb78;
  int in_stack_fffffffffffffb7c;
  Param *in_stack_fffffffffffffb80;
  int in_stack_fffffffffffffc54;
  int in_stack_fffffffffffffc58;
  int in_stack_fffffffffffffc5c;
  IMLE *in_stack_fffffffffffffc60;
  
  this = std::operator<<((ostream *)&std::cout,"\t --- Default constructor: ---");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  IMLE::IMLE(in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58,
             in_stack_fffffffffffffc54);
  IMLE::Param::Param(in_stack_fffffffffffffb80,in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78);
  this_00 = (Matrix<double,__1,_1,_0,__1,_1> *)0x3fb999999999999a;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Constant
            (in_stack_fffffffffffffb48,(Scalar *)in_stack_fffffffffffffb40);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=(this_00,in_stack_fffffffffffffb28);
  IMLE::setParameters(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
  cos1D_train<IMLE>(in_stack_000005e0,in_stack_000005dc);
  cos1D_predict<IMLE>(in_stack_00000780);
  IMLE::Param::~Param(in_stack_fffffffffffffb40);
  IMLE::~IMLE(in_stack_fffffffffffffb70);
  return;
}

Assistant:

void demo1()
{
    int d = 1;    //Input dimension
    int D = 1;    //Output dimension

    // Default constructor:
    cout << "\t --- Default constructor: ---" << endl;
    IMLE imleObj(d,D);

    //      IMLE Parameters
    IMLE::Param param(d,D);
    param.Psi0 = IMLE::X::Constant(D,0.1);
    param.sigma0 = 1.0;
    param.p0 = 0.2;
    param.multiValuedSignificance = 0.9;

    imleObj.setParameters(param);

    cos1D_train(imleObj);
    cos1D_predict(imleObj);
}